

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenCapability(Lexer *this)

{
  Lexer *in_RSI;
  undefined1 local_42 [26];
  
  nextChar(in_RSI);
  if (in_RSI->currentChar == 0x21) {
    nextChar(in_RSI);
    local_42._0_2_ = 4;
    getCurrentCursor((Position *)(local_42 + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_42);
  }
  else {
    local_42._0_2_ = 3;
    getCurrentCursor((Position *)(local_42 + 2),in_RSI);
    std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
              ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)local_42);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenCapability() noexcept {
  nextChar(); // eat #
  if (currentChar == '!') {
    nextChar(); // eat !
    return std::make_unique<Token>(currentToken,
        TokenType::TOK_ENSURE, getCurrentCursor());
  }

  return std::make_unique<Token>(currentToken,
      TokenType::TOK_DIRECTIVE, getCurrentCursor());
}